

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

bool EqualRegion(QRegionPrivate *r1,QRegionPrivate *r2)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  QRect *pQVar6;
  QRect *pQVar7;
  long lVar8;
  
  iVar3 = r1->numRects;
  iVar5 = r2->numRects;
  if (iVar3 == iVar5) {
    if (iVar3 == 0) {
      return true;
    }
    if (((((r1->extents).x1.m_i == (r2->extents).x1.m_i) &&
         ((r1->extents).x2.m_i == (r2->extents).x2.m_i)) &&
        ((r1->extents).y1.m_i == (r2->extents).y1.m_i)) &&
       ((r1->extents).y2.m_i == (r2->extents).y2.m_i)) {
      if (iVar5 == 1 && iVar3 == 1) {
        return true;
      }
      if (iVar3 == 1) {
        pQVar7 = &r1->extents;
      }
      else {
        pQVar7 = (r1->rects).d.ptr;
      }
      if (iVar5 == 1) {
        pQVar6 = &r2->extents;
      }
      else {
        pQVar6 = (r2->rects).d.ptr;
      }
      bVar4 = iVar3 < 1;
      if (iVar3 < 1) {
        return bVar4;
      }
      if ((pQVar7->x1).m_i != (pQVar6->x1).m_i) {
        return bVar4;
      }
      iVar5 = 1;
      lVar8 = 0x10;
      while( true ) {
        if (*(int *)((long)pQVar7 + lVar8 + -8) != *(int *)((long)pQVar6 + lVar8 + -8)) {
          return bVar4;
        }
        if (*(int *)((long)pQVar7 + lVar8 + -0xc) != *(int *)((long)pQVar6 + lVar8 + -0xc)) {
          return bVar4;
        }
        if (*(int *)((long)pQVar7 + lVar8 + -4) != *(int *)((long)pQVar6 + lVar8 + -4)) {
          return bVar4;
        }
        bVar4 = iVar3 <= iVar5;
        if (iVar5 == iVar3) break;
        piVar1 = (int *)((long)&(pQVar7->x1).m_i + lVar8);
        iVar5 = iVar5 + 1;
        piVar2 = (int *)((long)&(pQVar6->x1).m_i + lVar8);
        lVar8 = lVar8 + 0x10;
        if (*piVar1 != *piVar2) {
          return bVar4;
        }
      }
      return bVar4;
    }
  }
  return false;
}

Assistant:

static bool EqualRegion(const QRegionPrivate *r1, const QRegionPrivate *r2)
{
    if (r1->numRects != r2->numRects) {
        return false;
    } else if (r1->numRects == 0) {
        return true;
    } else if (r1->extents != r2->extents) {
        return false;
    } else if (r1->numRects == 1 && r2->numRects == 1) {
        return true; // equality tested in previous if-statement
    } else {
        const QRect *rr1 = (r1->numRects == 1) ? &r1->extents : r1->rects.constData();
        const QRect *rr2 = (r2->numRects == 1) ? &r2->extents : r2->rects.constData();
        for (int i = 0; i < r1->numRects; ++i, ++rr1, ++rr2) {
            if (*rr1 != *rr2)
                return false;
        }
    }

    return true;
}